

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O3

void __thiscall tcu::x11::XlibWindow::setDimensions(XlibWindow *this,int width,int height)

{
  Display *pDVar1;
  XEvent myevent;
  XWindowChanges changes;
  int local_110 [14];
  uint local_d8;
  int local_d4;
  int local_48;
  int local_44;
  
  pDVar1 = this->m_display->m_display;
  local_48 = width;
  local_44 = height;
  XConfigureWindow(pDVar1,this->m_window,0xc);
  XFlush(pDVar1);
  do {
    while( true ) {
      XNextEvent(pDVar1,local_110);
      if (local_110[0] == 0x16) break;
      if ((local_110[0] == 0x21) && ((ulong)local_d8 == this->m_display->m_deleteAtom)) {
        EventState::setQuitFlag((this->m_display->super_DisplayBase).m_eventState,true);
      }
    }
  } while ((local_d8 != width) || (local_d4 != height));
  return;
}

Assistant:

void XlibWindow::setDimensions (int width, int height)
{
	const unsigned int	mask		= CWWidth | CWHeight;
	XWindowChanges		changes;
	::Display*			dpy			= m_display.getXDisplay();
	XEvent				myevent;
	changes.width	= width;
	changes.height	= height;
	XConfigureWindow(dpy, m_window, mask, &changes);
	XFlush(dpy);

	for(;;)
	{
		XNextEvent(dpy, &myevent);
		if (myevent.type == ConfigureNotify) {
			XConfigureEvent e = myevent.xconfigure;
			if (e.width == width && e.height == height)
				break;
		}
		else
			m_display.processEvent(myevent);
	}
}